

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PointSizeCase::iterate(PointSizeCase *this)

{
  int iVar1;
  ostringstream *poVar2;
  uint uVar3;
  RenderContext *context;
  TestLog *pTVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  deUint32 dVar9;
  ChannelOrder CVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  RenderTarget *pRVar12;
  TestError *this_00;
  ConstPixelBufferAccess *access;
  void *__buf;
  qpTestResult testResult;
  char *pcVar13;
  int iVar14;
  void *data;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ChannelOrder CVar18;
  ChannelOrder CVar19;
  Surface resultImage;
  VertexArray vao;
  Surface local_240;
  int local_224;
  ConstPixelBufferAccess local_220;
  string local_1f8;
  TextureFormat local_1d8;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  long lVar11;
  
  tcu::Surface::Surface(&local_240,0x20,0x20);
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar7);
  uVar3 = this->m_flags;
  iVar7 = (**(code **)(lVar11 + 0x780))((this->m_program->m_program).m_program,"a_position");
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_220,(Functions *)CONCAT44(extraout_var_00,iVar8),traits);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Rendering single point.",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  if (iVar7 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = &local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Attribute a_position location was -1","");
    tcu::TestError::TestError(this_00,(string *)local_1b0);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar11 + 0x1a00))(0,0,0x20,0x20);
  (**(code **)(lVar11 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar11 + 0x188))(0x4000);
  dVar9 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar9,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x734);
  (**(code **)(lVar11 + 0xd8))(local_220.m_size.m_data[2]);
  dVar9 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar9,"bind vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x737);
  (**(code **)(lVar11 + 0x1680))((this->m_program->m_program).m_program);
  dVar9 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar9,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x73a);
  (**(code **)(lVar11 + 0x1858))(0,0,0,0x3f800000,iVar7);
  if ((uVar3 & 0x1e) == 0) {
    (**(code **)(lVar11 + 0x538))(0,0,1);
    dVar9 = (**(code **)(lVar11 + 0x800))();
    iVar7 = 0x749;
    pcVar13 = "draw points";
  }
  else {
    (**(code **)(lVar11 + 0xfd8))(0x8e72,1);
    dVar9 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar9,"set patch param",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x741);
    (**(code **)(lVar11 + 0x538))(0xe,0,1);
    dVar9 = (**(code **)(lVar11 + 0x800))();
    iVar7 = 0x744;
    pcVar13 = "draw patches";
  }
  glu::checkError(dVar9,pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,iVar7);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1f8._M_dataplus._M_p = (pointer)0x300000008;
  data = (void *)local_240.m_pixels.m_cap;
  if ((void *)local_240.m_pixels.m_cap != (void *)0x0) {
    data = local_240.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_1f8,local_240.m_width,
             local_240.m_height,1,data);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_220);
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_224 = pRVar12->m_numSamples;
  CVar10 = getExpectedPointSize((PointSizeCase *)(ulong)(uint)this->m_flags);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Verifying rendered point size. Expecting ",0x29);
  std::ostream::operator<<(poVar2,CVar10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," pixels.",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1f8.field_2._M_allocated_capacity._0_7_ = 0x497265646e6552;
  local_1f8.field_2._7_4_ = 0x6567616d;
  local_1f8._M_string_length = 0xb;
  local_1f8.field_2._M_local_buf[0xb] = '\0';
  local_1d0.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
  local_1d0.field_2._M_allocated_capacity._6_2_ = 0x6465;
  local_1d0.field_2._8_6_ = 0x6567616d6920;
  local_1d0._M_string_length = 0xe;
  local_1d0.field_2._M_local_buf[0xe] = '\0';
  local_1d8.order = RGBA;
  local_1d8.type = UNORM_INT8;
  if ((void *)local_240.m_pixels.m_cap != (void *)0x0) {
    local_240.m_pixels.m_cap = (size_t)local_240.m_pixels.m_ptr;
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_220,&local_1d8,local_240.m_width,local_240.m_height,1,
             (void *)local_240.m_pixels.m_cap);
  access = &local_220;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_1f8,&local_1d0,access,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar4,__buf,(size_t)access);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,
                    CONCAT26(local_1d0.field_2._M_allocated_capacity._6_2_,
                             local_1d0.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT17(local_1f8.field_2._M_local_buf[7],
                             local_1f8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (local_240.m_height < 1) {
LAB_015aaae3:
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Verification failed, could not find any point fragments."
               ,0x38);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    iVar14 = 0;
    bVar6 = false;
    iVar8 = 0;
    iVar7 = 0;
    iVar16 = 0;
    iVar17 = 0;
    do {
      if (0 < local_240.m_width) {
        iVar1 = iVar14 + 1;
        uVar15 = 0;
        do {
          iVar5 = (int)uVar15;
          if ((*(uint *)((long)local_240.m_pixels.m_ptr +
                        (long)(iVar14 * local_240.m_width + iVar5) * 4) & 0xffffff) != 0) {
            if (bVar6) {
              if (iVar5 <= iVar8) {
                iVar8 = iVar5;
              }
              if (iVar14 <= iVar7) {
                iVar7 = iVar14;
              }
              if (iVar16 <= iVar5 + 1) {
                iVar16 = iVar5 + 1;
              }
              if (iVar17 <= iVar1) {
                iVar17 = iVar1;
              }
            }
            else {
              iVar16 = iVar5 + 1;
              bVar6 = true;
              iVar8 = iVar5;
              iVar7 = iVar14;
              iVar17 = iVar1;
            }
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != (uint)local_240.m_width);
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != local_240.m_height);
    if (!bVar6) goto LAB_015aaae3;
    CVar19 = iVar16 - iVar8;
    local_220.m_format.type = iVar17 - iVar7;
    local_220.m_format.order = CVar19;
    if (local_224 < 2) {
      if (CVar19 == local_220.m_format.type) {
        if (CVar19 == CVar10) goto LAB_015aac1f;
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"ERROR! Point size invalid, expected ",0x24);
        std::ostream::operator<<(poVar2,CVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", got ",6);
        std::ostream::operator<<(poVar2,CVar19);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"ERROR! Rasterized point is not a square. Point size was ",0x38
                  );
        tcu::operator<<((ostream *)poVar2,(Vector<int,_2> *)&local_220);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    else {
      iVar8 = CVar19 - local_220.m_format.type;
      iVar7 = -iVar8;
      if (0 < iVar8) {
        iVar7 = iVar8;
      }
      if (iVar7 < 2) {
        CVar18 = local_220.m_format.type;
        if ((int)local_220.m_format.type < (int)CVar19) {
          CVar18 = CVar19;
        }
        if (CVar10 + A == CVar18 || CVar10 == CVar18) {
LAB_015aac1f:
          pcVar13 = "Pass";
          testResult = QP_TEST_RESULT_PASS;
          goto LAB_015aab4f;
        }
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"ERROR! Point size invalid, expected ",0x24);
        std::ostream::operator<<(poVar2,CVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", got ",6);
        std::ostream::operator<<(poVar2,CVar18);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,
                   "ERROR! Rasterized point is not a square. Detected point size was ",0x41);
        tcu::operator<<((ostream *)poVar2,(Vector<int,_2> *)&local_220);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  pcVar13 = "Image verification failed";
  testResult = QP_TEST_RESULT_FAIL;
LAB_015aab4f:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar13);
  tcu::Surface::~Surface(&local_240);
  return STOP;
}

Assistant:

PointSizeCase::IterateResult PointSizeCase::iterate (void)
{
	tcu::Surface resultImage(RENDER_SIZE, RENDER_SIZE);

	renderTo(resultImage);

	if (verifyImage(resultImage))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}